

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O2

LispPTR LCFetchMethodOrHelp(LispPTR object,LispPTR selector)

{
  LispPTR *pLVar1;
  long lVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  LispPTR *pLVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  if (atom_instance == 0) {
    LCinit();
  }
  uVar8 = *(ushort *)((ulong)(object >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  uVar8 = *(uint *)((long)DTDspace + (ulong)uVar8 * 4 + (ulong)(uVar8 << 5)) & 0xfffffff;
  if ((uVar8 == atom_instance) || (uVar8 == atom_class)) {
    pLVar4 = NativeAligned4FromLAddr(object);
    uVar8 = *pLVar4;
    uVar7 = (ulong)(((uVar8 ^ selector) & 0x3ff) << 4);
    pLVar1 = (LispPTR *)((long)&LCMethodCache->class + uVar7);
    if ((*(uint *)((long)&LCMethodCache->class + uVar7) == uVar8) && (pLVar1[1] == selector)) {
      return pLVar1[2];
    }
    pLVar5 = NativeAligned4FromLAddr(uVar8);
    LVar3 = pLVar5[8];
    while( true ) {
      pLVar5 = NativeAligned4FromLAddr(uVar8);
      if (pLVar5[0xb] != 0) {
        pLVar6 = NativeAligned4FromLAddr(pLVar5[0xb]);
        lVar2 = 0;
        while (lVar9 = lVar2, *(LispPTR *)((long)pLVar6 + lVar9) != 0) {
          lVar2 = lVar9 + 4;
          if (*(LispPTR *)((long)pLVar6 + lVar9) == selector) {
            *pLVar1 = *pLVar4;
            pLVar1[1] = selector;
            pLVar4 = NativeAligned4FromLAddr(pLVar5[0xc]);
            LVar3 = *(LispPTR *)((long)pLVar4 + lVar9);
            pLVar1[2] = LVar3;
            return LVar3;
          }
        }
      }
      uVar8 = car(LVar3);
      if (uVar8 == 0) break;
      LVar3 = cdr(LVar3);
    }
  }
  lcfuncall(atom_FetchMethodOrHelp_LCUFN,2,3);
  return 0xfffffffe;
}

Assistant:

LispPTR LCFetchMethodOrHelp(LispPTR object, LispPTR selector) {
  struct LCInstance *objptr;
  struct LCMethodCacheEntry *ce;
  LispPTR cur_class;

  LC_INIT;

  INSTANCE_CLASS_OR_PUNT(object, atom_FetchMethodOrHelp_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  ce = &(LCMethodCache[METH_CACHE_INDEX((cur_class = objptr->class), selector)]);
  if (ce->class == cur_class && ce->selector == selector) return ce->method_fn;

  /* not in cache, search class then supers */
  {
    LispPTR supers = ((struct LCClass *)NativeAligned4FromLAddr(cur_class))->supers;

    for (;;) {
      int i = 0;
      LispPTR val;
      LispPTR *selectorptr;
      struct LCClass *classptr;

      classptr = (struct LCClass *)NativeAligned4FromLAddr(cur_class);
      if (classptr->selectors == NIL_PTR) {
        goto next_class;
      } else {
        selectorptr = (LispPTR *)NativeAligned4FromLAddr(classptr->selectors);
      }

      while ((val = selectorptr[i++]) != NIL_PTR) {
        if (val == selector) {
          ce->class = objptr->class;
          ce->selector = selector;
          return (ce->method_fn = ((LispPTR *)NativeAligned4FromLAddr(classptr->methods))[i - 1]);
        }
      }

    next_class:
      if ((cur_class = car(supers)) == NIL_PTR) break;
      supers = cdr(supers);
    }
  }

  /* we didn't find it at all; punt */
  RETCALL(atom_FetchMethodOrHelp_LCUFN, 2);

  /*  return lcfuncall(atom_FetchMethodOrHelp_LCUFN,2,3); */
  /*  return PUNT;*/
}